

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void __thiscall
nonstd::optional_lite::detail::storage_t<tinyusdz::Reference>::destruct_value
          (storage_t<tinyusdz::Reference> *this)

{
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
              *)(this + 0x120),*(_Link_type *)(this + 0x130));
  tinyusdz::Path::~Path((Path *)(this + 0x40));
  if (*(storage_t<tinyusdz::Reference> **)(this + 0x20) != this + 0x30) {
    operator_delete(*(storage_t<tinyusdz::Reference> **)(this + 0x20),*(long *)(this + 0x30) + 1);
  }
  if (*(storage_t<tinyusdz::Reference> **)this != this + 0x10) {
    operator_delete(*(storage_t<tinyusdz::Reference> **)this,*(long *)(this + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

void destruct_value()
    {
        value_ptr()->~T();
    }